

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
AnalyzeClassDefinition
          (ExpressionContext *ctx,SynClassDefinition *syntax,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> generics)

{
  ScopeData **ppSVar1;
  Allocator *allocator;
  ConstantData *pCVar2;
  undefined1 auVar3 [12];
  ExprBase *pEVar4;
  IntrusiveList<MatchData> generics_00;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint offset;
  int iVar8;
  TypeBase *pTVar9;
  ScopeData *pSVar10;
  TypeClass **ppTVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeClass *pTVar13;
  undefined4 extraout_var_01;
  ExprClassDefinition *classDefinition;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  MemberHandle *node;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ConstantData *node_00;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  char *msg;
  IntrusiveList<MatchData> *pIVar14;
  SynIdentifier *pSVar15;
  SynIdentifier *pSVar16;
  bool bVar17;
  TypeHandle *pTVar18;
  IntrusiveList<ConstantData> *pIVar19;
  InplaceStr name;
  InplaceStr name_00;
  IntrusiveList<TypeHandle> generics_01;
  TypeClass *local_f0;
  InplaceStr className;
  uint local_d4;
  InplaceStr typeName;
  IntrusiveList<TypeHandle> generics_local;
  TraceScope traceScope;
  IntrusiveList<MatchData> actualGenerics;
  SynIdentifier local_80;
  MatchData *pMVar12;
  VariableData *this;
  undefined4 extraout_var_02;
  undefined4 extraout_var_06;
  undefined4 extraout_var_09;
  
  name_00.end = generics.tail;
  generics_local.head = generics.head;
  name_00.begin = (syntax->name->name).end;
  generics_local.tail = name_00.end;
  anon_unknown.dwarf_94284::CheckTypeConflict
            ((anon_unknown_dwarf_94284 *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(syntax->name->name).begin,name_00);
  typeName = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  if ((AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
       ::token == '\0') &&
     (iVar7 = __cxa_guard_acquire(&AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
                                   ::token), iVar7 != 0)) {
    AnalyzeClassDefinition::token = NULLC::TraceGetToken("analyze","AnalyzeClassDefinition");
    __cxa_guard_release(&AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
                         ::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,AnalyzeClassDefinition::token);
  NULLC::TraceLabel(typeName.begin,typeName.end);
  ppSVar1 = &ctx->scope;
  if ((proto == (TypeGenericClassProto *)0x0) &&
     (pSVar16 = (syntax->aliases).head, pSVar16 != (SynIdentifier *)0x0)) {
    while (pSVar16 != (SynIdentifier *)0x0) {
      uVar5 = InplaceStr::hash(&pSVar16->name);
      pTVar9 = anon_unknown.dwarf_94284::LookupTypeByName(ctx,uVar5);
      if (pTVar9 != (TypeBase *)0x0) {
        anon_unknown.dwarf_94284::Stop
                  (ctx,&pSVar16->super_SynBase,
                   "ERROR: there is already a type or an alias with the same name");
      }
      pSVar15 = (syntax->aliases).head;
      while ((pSVar15 != (SynIdentifier *)0x0 && (pSVar15 != pSVar16))) {
        bVar17 = InplaceStr::operator==(&pSVar15->name,&pSVar16->name);
        if (bVar17) {
          anon_unknown.dwarf_94284::Stop
                    (ctx,&pSVar16->super_SynBase,
                     "ERROR: there is already a type or an alias with the same name");
        }
        pSVar15 = (SynIdentifier *)(pSVar15->super_SynBase).next;
        if ((pSVar15 == (SynIdentifier *)0x0) || ((pSVar15->super_SynBase).typeID != 4)) {
          pSVar15 = (SynIdentifier *)0x0;
        }
      }
      pSVar16 = (SynIdentifier *)(pSVar16->super_SynBase).next;
      if ((pSVar16 == (SynIdentifier *)0x0) || ((pSVar16->super_SynBase).typeID != 4)) {
        pSVar16 = (SynIdentifier *)0x0;
      }
    }
    uVar5 = InplaceStr::hash(&typeName);
    pTVar9 = anon_unknown.dwarf_94284::LookupTypeByName(ctx,uVar5);
    if (pTVar9 != (TypeBase *)0x0) {
      msg = "ERROR: \'%.*s\' is being redefined";
      if (pTVar9->typeID == 0x18) {
        msg = "ERROR: type \'%.*s\' was forward declared as a non-generic type";
      }
      anon_unknown.dwarf_94284::Stop
                (ctx,&syntax->super_SynBase,msg,
                 (ulong)(uint)((int)typeName.end - (int)typeName.begin));
    }
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
    pTVar13 = (TypeClass *)CONCAT44(extraout_var_10,iVar7);
    SynIdentifier::SynIdentifier(&local_80,syntax->name,typeName);
    TypeGenericClassProto::TypeGenericClassProto
              ((TypeGenericClassProto *)pTVar13,&local_80,&syntax->super_SynBase,*ppSVar1,syntax);
    ExpressionContext::AddType(ctx,(TypeBase *)pTVar13);
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    classDefinition = (ExprClassDefinition *)CONCAT44(extraout_var_11,iVar7);
    pTVar9 = ctx->typeVoid;
    (classDefinition->super_ExprBase).typeID = 0x2c;
    (classDefinition->super_ExprBase).source = &syntax->super_SynBase;
    (classDefinition->super_ExprBase).type = pTVar9;
    (classDefinition->super_ExprBase).next = (ExprBase *)0x0;
    (classDefinition->super_ExprBase).listed = false;
    (classDefinition->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00224158;
    classDefinition->classType = pTVar13;
    goto LAB_0014e563;
  }
  uVar5 = IntrusiveList<TypeHandle>::size(&generics_local);
  uVar6 = IntrusiveList<SynIdentifier>::size(&syntax->aliases);
  if (uVar5 != uVar6) {
    __assert_fail("generics.size() == syntax->aliases.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x29ba,
                  "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                 );
  }
  if (generics_local.head == (TypeHandle *)0x0) {
    className._0_12_ = typeName._0_12_;
    auVar3 = (undefined1  [12])className._0_12_;
    className = typeName;
  }
  else {
    generics_01.tail = generics_local.tail;
    generics_01.head = generics_local.head;
    className = GetGenericClassTypeName(ctx,&proto->super_TypeBase,generics_01);
    auVar3 = className._0_12_;
  }
  if (0x2000 < (uint)(auVar3._8_4_ - auVar3._0_4_)) {
    anon_unknown.dwarf_94284::Stop
              (ctx,&syntax->super_SynBase,
               "ERROR: generated type name exceeds maximum type length \'%d\'",0x2000);
  }
  uVar5 = InplaceStr::hash(&className);
  local_f0 = (TypeClass *)anon_unknown.dwarf_94284::LookupTypeByName(ctx,uVar5);
  if (local_f0 != (TypeClass *)0x0) {
    if (((local_f0->super_TypeStruct).super_TypeBase.typeID != 0x18) ||
       (pSVar10 = (ScopeData *)ppSVar1, local_f0->completed != false)) {
      anon_unknown.dwarf_94284::Stop
                (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                 (ulong)(uint)((int)className.end - (int)className.begin));
    }
    while (pSVar10 = pSVar10->scope, pSVar10 != (ScopeData *)0x0) {
      if ((TypeClass *)pSVar10->ownerType == local_f0) {
        anon_unknown.dwarf_94284::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                   (ulong)(uint)((int)className.end - (int)className.begin));
      }
    }
  }
  if (generics_local.head != (TypeHandle *)0x0) {
    uVar5 = InplaceStr::hash(&className);
    ppTVar11 = HashMap<TypeClass_*>::find(&ctx->genericTypeMap,uVar5);
    if (ppTVar11 != (TypeClass **)0x0) {
      __assert_fail("ctx.genericTypeMap.find(className.hash()) == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x29d7,
                    "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                   );
    }
  }
  if (syntax->align == (SynAlign *)0x0) {
    local_d4 = 0;
  }
  else {
    local_d4 = AnalyzeAlignment(ctx,syntax->align);
  }
  pIVar14 = &actualGenerics;
  actualGenerics.head = (MatchData *)0x0;
  actualGenerics.tail = (MatchData *)0x0;
  pSVar16 = (syntax->aliases).head;
  pTVar18 = generics_local.head;
  while ((pTVar18 != (TypeHandle *)0x0 && (pSVar16 != (SynIdentifier *)0x0))) {
    if ((pTVar18->type != (TypeBase *)0x0) && (pTVar18->type->typeID == 0)) {
      __assert_fail("!isType<TypeError>(currType->type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x29e4,
                    "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                   );
    }
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pMVar12 = (MatchData *)CONCAT44(extraout_var,iVar7);
    pTVar9 = pTVar18->type;
    pMVar12->name = pSVar16;
    pMVar12->type = pTVar9;
    pMVar12->next = (MatchData *)0x0;
    pMVar12->listed = false;
    IntrusiveList<MatchData>::push_back(pIVar14,pMVar12);
    pTVar18 = pTVar18->next;
    pSVar16 = (SynIdentifier *)(pSVar16->super_SynBase).next;
    if ((pSVar16 == (SynIdentifier *)0x0) || ((pSVar16->super_SynBase).typeID != 4)) {
      pSVar16 = (SynIdentifier *)0x0;
    }
  }
  if (syntax->baseClass == (SynBase *)0x0) {
LAB_0014e0ae:
    pTVar13 = (TypeClass *)0x0;
  }
  else {
    ExpressionContext::PushTemporaryScope(ctx);
    while (pMVar12 = pIVar14->head, pMVar12 != (MatchData *)0x0) {
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pSVar16 = pMVar12->name;
      pTVar9 = pMVar12->type;
      uVar5 = ctx->uniqueAliasId;
      ctx->uniqueAliasId = uVar5 + 1;
      AliasData::AliasData
                ((AliasData *)CONCAT44(extraout_var_00,iVar7),&syntax->super_SynBase,ctx->scope,
                 pTVar9,pSVar16,uVar5);
      ExpressionContext::AddAlias(ctx,(AliasData *)CONCAT44(extraout_var_00,iVar7));
      pIVar14 = (IntrusiveList<MatchData> *)&pMVar12->next;
    }
    pTVar13 = (TypeClass *)AnalyzeType(ctx,syntax->baseClass,true,(bool *)0x0);
    ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY);
    if (pTVar13 == (TypeClass *)0x0) {
LAB_0014e090:
      anon_unknown.dwarf_94284::Stop
                (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not extendable",
                 (ulong)(uint)(*(int *)&(pTVar13->super_TypeStruct).super_TypeBase.name.end -
                              (int)(pTVar13->super_TypeStruct).super_TypeBase.name.begin));
    }
    uVar5 = (pTVar13->super_TypeStruct).super_TypeBase.typeID;
    if (uVar5 == 0) goto LAB_0014e0ae;
    if ((uVar5 != 0x18) || (pTVar13->extendable == false)) goto LAB_0014e090;
  }
  bVar17 = (bool)(pTVar13 != (TypeClass *)0x0 | syntax->extendable);
  if (local_f0 == (TypeClass *)0x0) {
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
    local_f0 = (TypeClass *)CONCAT44(extraout_var_01,iVar7);
    allocator = ctx->allocator;
    SynIdentifier::SynIdentifier(&local_80,syntax->name,className);
    generics_00.tail._0_4_ = (int)actualGenerics.tail;
    generics_00.head = actualGenerics.head;
    generics_00.tail._4_4_ = (int)((ulong)actualGenerics.tail >> 0x20);
    TypeClass::TypeClass
              (local_f0,allocator,&local_80,&syntax->super_SynBase,*ppSVar1,proto,generics_00,bVar17
               ,pTVar13);
    ExpressionContext::AddType(ctx,(TypeBase *)local_f0);
  }
  else {
    local_f0->extendable = bVar17;
    local_f0->baseClass = pTVar13;
  }
  if (generics_local.head != (TypeHandle *)0x0) {
    uVar5 = InplaceStr::hash(&className);
    HashMap<TypeClass_*>::insert(&ctx->genericTypeMap,uVar5,local_f0);
  }
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
  classDefinition = (ExprClassDefinition *)CONCAT44(extraout_var_02,iVar7);
  pTVar9 = ctx->typeVoid;
  (classDefinition->super_ExprBase).typeID = 0x2d;
  (classDefinition->super_ExprBase).source = &syntax->super_SynBase;
  (classDefinition->super_ExprBase).type = pTVar9;
  (classDefinition->super_ExprBase).next = (ExprBase *)0x0;
  (classDefinition->super_ExprBase).listed = false;
  (classDefinition->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00224190;
  classDefinition->classType = local_f0;
  (classDefinition->aliases).head = (ExprAliasDefinition *)0x0;
  (classDefinition->aliases).tail = (ExprAliasDefinition *)0x0;
  (classDefinition->functions).head = (ExprBase *)0x0;
  (classDefinition->functions).tail = (ExprBase *)0x0;
  ExpressionContext::PushScope(ctx,(TypeBase *)local_f0);
  (local_f0->super_TypeStruct).typeScope = ctx->scope;
  pIVar14 = &local_f0->generics;
  while (pMVar12 = pIVar14->head, pMVar12 != (MatchData *)0x0) {
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pSVar16 = pMVar12->name;
    pTVar9 = pMVar12->type;
    uVar5 = ctx->uniqueAliasId;
    ctx->uniqueAliasId = uVar5 + 1;
    AliasData::AliasData
              ((AliasData *)CONCAT44(extraout_var_03,iVar7),&syntax->super_SynBase,ctx->scope,pTVar9
               ,pSVar16,uVar5);
    ExpressionContext::AddAlias(ctx,(AliasData *)CONCAT44(extraout_var_03,iVar7));
    pIVar14 = (IntrusiveList<MatchData> *)&pMVar12->next;
  }
  if (bVar17 != false) {
    offset = anon_unknown.dwarf_94284::AllocateVariableInScope
                       (ctx,&syntax->super_SynBase,ctx->typeTypeID->alignment,ctx->typeTypeID);
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    name.end = "";
    name.begin = "$typeid";
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_04,iVar7),name);
    iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    this = (VariableData *)CONCAT44(extraout_var_05,iVar8);
    uVar5 = ctx->typeTypeID->alignment;
    uVar6 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar6 + 1;
    VariableData::VariableData
              (this,ctx->allocator,&syntax->super_SynBase,ctx->scope,uVar5,ctx->typeTypeID,
               (SynIdentifier *)CONCAT44(extraout_var_04,iVar7),offset,uVar6);
    ExpressionContext::AddVariable(ctx,this,false);
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
    node = (MemberHandle *)CONCAT44(extraout_var_06,iVar7);
    node->source = (SynBase *)0x0;
    node->variable = this;
    node->initializer = (SynBase *)0x0;
    node->next = (MemberHandle *)0x0;
    node->listed = false;
    IntrusiveList<MemberHandle>::push_back(&(local_f0->super_TypeStruct).members,node);
    if (pTVar13 != (TypeClass *)0x0) {
      (local_f0->super_TypeStruct).super_TypeBase.alignment =
           (pTVar13->super_TypeStruct).super_TypeBase.alignment;
      pIVar14 = &pTVar13->aliases;
      while (pMVar12 = pIVar14->head, pMVar12 != (MatchData *)0x0) {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pSVar16 = pMVar12->name;
        pTVar9 = pMVar12->type;
        uVar5 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar5 + 1;
        AliasData::AliasData
                  ((AliasData *)CONCAT44(extraout_var_07,iVar7),&syntax->super_SynBase,ctx->scope,
                   pTVar9,pSVar16,uVar5);
        ExpressionContext::AddAlias(ctx,(AliasData *)CONCAT44(extraout_var_07,iVar7));
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        MatchData::MatchData
                  ((MatchData *)CONCAT44(extraout_var_08,iVar7),pMVar12->name,pMVar12->type);
        IntrusiveList<MatchData>::push_back
                  (&local_f0->aliases,(MatchData *)CONCAT44(extraout_var_08,iVar7));
        pIVar14 = (IntrusiveList<MatchData> *)&pMVar12->next;
      }
      AddBaseClassMemberVariables(ctx,&syntax->super_SynBase,pTVar13,local_f0);
      pIVar19 = &(pTVar13->super_TypeStruct).constants;
      while (pCVar2 = pIVar19->head, pCVar2 != (ConstantData *)0x0) {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        node_00 = (ConstantData *)CONCAT44(extraout_var_09,iVar7);
        pEVar4 = pCVar2->value;
        node_00->name = pCVar2->name;
        node_00->value = pEVar4;
        node_00->next = (ConstantData *)0x0;
        node_00->listed = false;
        IntrusiveList<ConstantData>::push_back(&(local_f0->super_TypeStruct).constants,node_00);
        pIVar19 = (IntrusiveList<ConstantData> *)&pCVar2->next;
      }
      anon_unknown.dwarf_94284::FinalizeAlignment(&local_f0->super_TypeStruct);
      if ((local_f0->super_TypeStruct).super_TypeBase.size !=
          (pTVar13->super_TypeStruct).super_TypeBase.size) {
        __assert_fail("classType->size == baseClass->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x2a43,
                      "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                     );
      }
    }
  }
  if (syntax->align != (SynAlign *)0x0) {
    (local_f0->super_TypeStruct).super_TypeBase.alignment = local_d4;
  }
  AnalyzeClassElements(ctx,classDefinition,syntax->elements);
  ExpressionContext::PopScope(ctx,SCOPE_TYPE);
LAB_0014e563:
  NULLC::TraceScope::~TraceScope(&traceScope);
  return &classDefinition->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeClassDefinition(ExpressionContext &ctx, SynClassDefinition *syntax, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> generics)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	TRACE_SCOPE("analyze", "AnalyzeClassDefinition");
	TRACE_LABEL2(typeName.begin, typeName.end);

	if(!proto && !syntax->aliases.empty())
	{
		for(SynIdentifier *curr = syntax->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
		{
			if(LookupTypeByName(ctx, curr->name.hash()))
				Stop(ctx, curr, "ERROR: there is already a type or an alias with the same name");

			for(SynIdentifier *prev = syntax->aliases.head; prev && prev != curr; prev = getType<SynIdentifier>(prev->next))
			{
				if(prev->name == curr->name)
					Stop(ctx, curr, "ERROR: there is already a type or an alias with the same name");
			}
		}

		if(TypeBase *type = LookupTypeByName(ctx, typeName.hash()))
		{
			TypeClass *originalDefinition = getType<TypeClass>(type);

			if(originalDefinition)
				Stop(ctx, syntax, "ERROR: type '%.*s' was forward declared as a non-generic type", FMT_ISTR(typeName));
			else
				Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(typeName));
		}

		TypeGenericClassProto *genericProtoType = new (ctx.get<TypeGenericClassProto>()) TypeGenericClassProto(SynIdentifier(syntax->name, typeName), syntax, ctx.scope, syntax);

		ctx.AddType(genericProtoType);

		return new (ctx.get<ExprGenericClassPrototype>()) ExprGenericClassPrototype(syntax, ctx.typeVoid, genericProtoType);
	}

	assert(generics.size() == syntax->aliases.size());

	InplaceStr className = generics.empty() ? typeName : GetGenericClassTypeName(ctx, proto, generics);

	if(className.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(ctx, syntax, "ERROR: generated type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	TypeClass *originalDefinition = NULL;

	if(TypeBase *type = LookupTypeByName(ctx, className.hash()))
	{
		originalDefinition = getType<TypeClass>(type);

		if(!originalDefinition)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));

		if(originalDefinition->completed)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));

		for(ScopeData *scope = ctx.scope; scope; scope = scope->scope)
		{
			if(scope->ownerType == originalDefinition)
				Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));
		}
	}

	if(!generics.empty())
	{
		// Check if type already exists
		assert(ctx.genericTypeMap.find(className.hash()) == NULL);
	}

	unsigned alignment = syntax->align ? AnalyzeAlignment(ctx, syntax->align) : 0;

	IntrusiveList<MatchData> actualGenerics;

	{
		TypeHandle *currType = generics.head;
		SynIdentifier *currName = syntax->aliases.head;

		while(currType && currName)
		{
			assert(!isType<TypeError>(currType->type));

			actualGenerics.push_back(new (ctx.get<MatchData>()) MatchData(currName, currType->type));

			currType = currType->next;
			currName = getType<SynIdentifier>(currName->next);
		}
	}

	TypeClass *baseClass = NULL;

	if(syntax->baseClass)
	{
		ctx.PushTemporaryScope();

		for(MatchData *el = actualGenerics.head; el; el = el->next)
			ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

		TypeBase *type = AnalyzeType(ctx, syntax->baseClass);

		ctx.PopScope(SCOPE_TEMPORARY);

		if(!isType<TypeError>(type))
		{
			baseClass = getType<TypeClass>(type);

			if(!baseClass || !baseClass->extendable)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not extendable", FMT_ISTR(type->name));
		}
	}
	
	bool extendable = syntax->extendable || baseClass;

	TypeClass *classType = NULL;
	
	if(originalDefinition)
	{
		classType = originalDefinition;

		classType->extendable = extendable;
		classType->baseClass = baseClass;
	}
	else
	{
		classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(syntax->name, className), syntax, ctx.scope, proto, actualGenerics, extendable, baseClass);

		ctx.AddType(classType);
	}

	if(!generics.empty())
		ctx.genericTypeMap.insert(className.hash(), classType);

	ExprClassDefinition *classDefinition = new (ctx.get<ExprClassDefinition>()) ExprClassDefinition(syntax, ctx.typeVoid, classType);

	ctx.PushScope(classType);

	classType->typeScope = ctx.scope;

	for(MatchData *el = classType->generics.head; el; el = el->next)
		ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

	// Base class adds a typeid member
	if(extendable)
	{
		unsigned offset = AllocateVariableInScope(ctx, syntax, ctx.typeTypeID->alignment, ctx.typeTypeID);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$typeid"));

		VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, ctx.typeTypeID->alignment, ctx.typeTypeID, nameIdentifier, offset, ctx.uniqueVariableId++);

		ctx.AddVariable(member, false);

		classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, member, NULL));
	}

	if(baseClass)
	{
		// Use base class alignment at ths point to match member locations
		classType->alignment = baseClass->alignment;

		// Add members of base class
		for(MatchData *el = baseClass->aliases.head; el; el = el->next)
		{
			ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			classType->aliases.push_back(new (ctx.get<MatchData>()) MatchData(el->name, el->type));
		}

		AddBaseClassMemberVariables(ctx, syntax, baseClass, classType);

		for(ConstantData *el = baseClass->constants.head; el; el = el->next)
			classType->constants.push_back(new (ctx.get<ConstantData>()) ConstantData(el->name, el->value));

		FinalizeAlignment(classType);

		assert(classType->size == baseClass->size);
	}

	if(syntax->align)
		classType->alignment = alignment;

	AnalyzeClassElements(ctx, classDefinition, syntax->elements);

	ctx.PopScope(SCOPE_TYPE);

	return classDefinition;
}